

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::detail::
db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::operator()(db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *this,leaf_type *to_delete)

{
  size_t size;
  unsigned_long pointer;
  qsbr_per_thread *this_00;
  debug_callback local_40;
  size_t local_20;
  unsigned_long leaf_size;
  leaf_type *to_delete_local;
  db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  leaf_size = (unsigned_long)to_delete;
  to_delete_local = (leaf_type *)this;
  local_20 = basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
             ::get_size(to_delete);
  this_00 = this_thread();
  pointer = leaf_size;
  size = local_20;
  std::function<void(void_const*)>::function<void(&)(void_const*)noexcept,void>
            ((function<void(void_const*)> *)&local_40,olc_node_header::check_on_dealloc);
  qsbr_per_thread::on_next_epoch_deallocate(this_00,(void *)pointer,size,&local_40);
  std::function<void_(const_void_*)>::~function(&local_40);
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::decrement_leaf_count(this->db_instance,local_20);
  return;
}

Assistant:

void operator()(leaf_type* to_delete) const {
#ifdef UNODB_DETAIL_WITH_STATS
    const auto leaf_size = to_delete->get_size();
#endif  // UNODB_DETAIL_WITH_STATS

    this_thread().on_next_epoch_deallocate(to_delete
#ifdef UNODB_DETAIL_WITH_STATS
                                           ,
                                           leaf_size
#endif  // UNODB_DETAIL_WITH_STATS
#ifndef NDEBUG
                                           ,
                                           olc_node_header::check_on_dealloc
#endif
    );

#ifdef UNODB_DETAIL_WITH_STATS
    db_instance.decrement_leaf_count(leaf_size);
#endif  // UNODB_DETAIL_WITH_STATS
  }